

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ushort uVar1;
  uint uVar2;
  unsigned_short *puVar3;
  undefined8 uVar4;
  undefined2 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImFontGlyph *pIVar10;
  ImFontGlyph *pIVar11;
  ImFontGlyph *pIVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  float *pfVar17;
  float *pfVar18;
  float fVar19;
  
  uVar16 = 0;
  for (lVar14 = 0; (ulong)(uint)(this->Glyphs).Size * 0x28 - lVar14 != 0; lVar14 = lVar14 + 0x28) {
    uVar1 = *(ushort *)((long)&((this->Glyphs).Data)->Codepoint + lVar14);
    if (uVar16 <= uVar1) {
      uVar16 = (uint)uVar1;
    }
  }
  ImVector<float>::clear(&this->IndexAdvanceX);
  ImVector<unsigned_short>::clear(&this->IndexLookup);
  this->DirtyLookupTables = false;
  GrowIndex(this,uVar16 + 1);
  uVar2 = (this->Glyphs).Size;
  lVar14 = (long)(int)uVar2;
  pIVar12 = (this->Glyphs).Data;
  pfVar18 = (this->IndexAdvanceX).Data;
  puVar3 = (this->IndexLookup).Data;
  uVar13 = 0;
  uVar15 = 0;
  if (0 < (int)uVar2) {
    uVar15 = (ulong)uVar2;
  }
  pfVar17 = &pIVar12->AdvanceX;
  for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
    uVar1 = ((ImFontGlyph *)(pfVar17 + -1))->Codepoint;
    pfVar18[uVar1] = *pfVar17;
    puVar3[uVar1] = (unsigned_short)uVar13;
    pfVar17 = pfVar17 + 10;
  }
  pIVar10 = FindGlyph(this,0x20);
  if (pIVar10 != (ImFontGlyph *)0x0) {
    if (pIVar12[lVar14 + -1].Codepoint != 9) {
      ImVector<ImFontGlyph>::resize(&this->Glyphs,uVar2 + 1);
      pIVar12 = (this->Glyphs).Data;
      lVar14 = (long)(this->Glyphs).Size;
    }
    pIVar11 = FindGlyph(this,0x20);
    uVar5 = *(undefined2 *)&pIVar11->field_0x2;
    fVar19 = pIVar11->AdvanceX;
    fVar6 = pIVar11->X0;
    fVar7 = pIVar11->Y0;
    fVar8 = pIVar11->X1;
    fVar9 = pIVar11->Y1;
    uVar4 = *(undefined8 *)&pIVar11->U0;
    pIVar10 = pIVar12 + lVar14 + -1;
    pIVar10->Codepoint = pIVar11->Codepoint;
    *(undefined2 *)&pIVar10->field_0x2 = uVar5;
    pIVar10->AdvanceX = fVar19;
    pIVar10->X0 = fVar6;
    pIVar10->Y0 = fVar7;
    pIVar10 = pIVar12 + lVar14 + -1;
    pIVar10->X1 = fVar8;
    pIVar10->Y1 = fVar9;
    *(undefined8 *)(&pIVar10->X1 + 2) = uVar4;
    fVar19 = pIVar11->V1;
    pIVar12[lVar14 + -1].U1 = pIVar11->U1;
    pIVar12[lVar14 + -1].V1 = fVar19;
    pIVar12[lVar14 + -1].Codepoint = 9;
    fVar19 = pIVar12[lVar14 + -1].AdvanceX * 4.0;
    pIVar12[lVar14 + -1].AdvanceX = fVar19;
    pfVar18 = (this->IndexAdvanceX).Data;
    pfVar18[9] = fVar19;
    (this->IndexLookup).Data[9] = (short)(this->Glyphs).Size - 1;
  }
  pIVar12 = FindGlyphNoFallback(this,this->FallbackChar);
  this->FallbackGlyph = pIVar12;
  fVar19 = 0.0;
  if (pIVar12 != (ImFontGlyph *)0x0) {
    fVar19 = pIVar12->AdvanceX;
  }
  this->FallbackAdvanceX = fVar19;
  for (uVar13 = 0; uVar16 + 1 != uVar13; uVar13 = uVar13 + 1) {
    if (pfVar18[uVar13] <= 0.0 && pfVar18[uVar13] != 0.0) {
      pfVar18[uVar13] = fVar19;
    }
  }
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= 4;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size-1);
    }

    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}